

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O1

string * __thiscall
t_haxe_generator::argument_list_abi_cxx11_
          (string *__return_storage_ptr__,t_haxe_generator *this,t_struct *tstruct)

{
  undefined8 *puVar1;
  pointer pcVar2;
  undefined8 *puVar3;
  pointer pptVar4;
  ulong uVar5;
  undefined8 uVar6;
  bool bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined8 *local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  string local_88;
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  t_struct *local_40;
  t_haxe_generator *local_38;
  
  local_48 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_48;
  local_38 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  pptVar4 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar4 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar7 = true;
    local_40 = tstruct;
    do {
      if (bVar7) {
        bVar7 = false;
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      pcVar2 = ((*pptVar4)->name_)._M_dataplus._M_p;
      local_68 = local_58;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar2,pcVar2 + ((*pptVar4)->name_)._M_string_length);
      std::__cxx11::string::append((char *)&local_68);
      type_name_abi_cxx11_(&local_88,local_38,(*pptVar4)->type_,false,false);
      uVar5 = 0xf;
      if (local_68 != local_58) {
        uVar5 = local_58[0];
      }
      if (uVar5 < local_88._M_string_length + local_60) {
        uVar6 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          uVar6 = local_88.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar6 < local_88._M_string_length + local_60) goto LAB_0023441c;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_68);
      }
      else {
LAB_0023441c:
        puVar3 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88._M_dataplus._M_p)
        ;
      }
      puVar1 = puVar3 + 2;
      if ((undefined8 *)*puVar3 == puVar1) {
        local_98 = *puVar1;
        uStack_90 = puVar3[3];
        local_a8 = &local_98;
      }
      else {
        local_98 = *puVar1;
        local_a8 = (undefined8 *)*puVar3;
      }
      *puVar3 = puVar1;
      puVar3[1] = 0;
      *(undefined1 *)puVar1 = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a8);
      if (local_a8 != &local_98) {
        operator_delete(local_a8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      if (local_68 != local_58) {
        operator_delete(local_68);
      }
      pptVar4 = pptVar4 + 1;
    } while (pptVar4 !=
             (local_40->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_haxe_generator::argument_list(t_struct* tstruct) {
  string result = "";

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  bool first = true;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
    } else {
      result += ", ";
    }
    result += (*f_iter)->get_name() + " : " + type_name((*f_iter)->get_type());
  }
  return result;
}